

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Config::~Config(Config *this)

{
  (this->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__Config_00174450;
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&(this->m_testSpec).m_filters);
  std::unique_ptr<const_Catch::IStream,_std::default_delete<const_Catch::IStream>_>::~unique_ptr
            (&this->m_stream);
  ConfigData::~ConfigData(&this->m_data);
  return;
}

Assistant:

virtual ~Config() {
        }